

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  Context<char> context;
  undefined1 local_378 [8];
  _Alloc_hider local_370;
  wchar_t local_360 [4];
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  Context<char> local_330;
  
  if (argc < 1) {
    iVar1 = 1;
  }
  else {
    iVar1 = atoi(argv[1]);
    if (argc < 3) {
      bVar4 = false;
    }
    else {
      local_350[0] = local_340;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"dry","");
      iVar2 = std::__cxx11::string::compare((char *)local_350);
      bVar4 = iVar2 == 0;
      if (local_350[0] != local_340) {
        operator_delete(local_350[0]);
      }
    }
    Centaurus::Context<char>::Context(&local_330,"../../grammars/xml.cgr");
    if (!bVar4) {
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      local_370._M_p = local_360;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_370,L"ElementBody",L"");
      iVar2 = Centaurus::Grammar<char>::get_machine_id(&local_330.m_grammar,(Identifier *)local_378)
      ;
      local_330.m_callbacks.
      super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar2] = parseElementBody;
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      if (local_370._M_p != local_360) {
        operator_delete(local_370._M_p);
      }
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      local_370._M_p = local_360;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_370,L"Name",L"");
      iVar2 = Centaurus::Grammar<char>::get_machine_id(&local_330.m_grammar,(Identifier *)local_378)
      ;
      local_330.m_callbacks.
      super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar2] = parseName;
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      if (local_370._M_p != local_360) {
        operator_delete(local_370._M_p);
      }
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      local_370._M_p = local_360;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_370,L"Value",L"");
      iVar2 = Centaurus::Grammar<char>::get_machine_id(&local_330.m_grammar,(Identifier *)local_378)
      ;
      local_330.m_callbacks.
      super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar2] = parseValue;
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      if (local_370._M_p != local_360) {
        operator_delete(local_370._M_p);
      }
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      local_370._M_p = local_360;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_370,L"Attribute",L"");
      iVar2 = Centaurus::Grammar<char>::get_machine_id(&local_330.m_grammar,(Identifier *)local_378)
      ;
      local_330.m_callbacks.
      super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar2] = parseAttribute;
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      if (local_370._M_p != local_360) {
        operator_delete(local_370._M_p);
      }
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      local_370._M_p = local_360;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_370,L"Content",L"");
      iVar2 = Centaurus::Grammar<char>::get_machine_id(&local_330.m_grammar,(Identifier *)local_378)
      ;
      local_330.m_callbacks.
      super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar2] = parseContent;
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      if (local_370._M_p != local_360) {
        operator_delete(local_370._M_p);
      }
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      local_370._M_p = local_360;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_370,L"Element",L"");
      iVar2 = Centaurus::Grammar<char>::get_machine_id(&local_330.m_grammar,(Identifier *)local_378)
      ;
      local_330.m_callbacks.
      super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar2] = parseElement;
      local_378 = (undefined1  [8])&PTR__Identifier_001a0cd8;
      if (local_370._M_p != local_360) {
        operator_delete(local_370._M_p);
      }
    }
    std::chrono::_V2::system_clock::now();
    Centaurus::Context<char>::parse(&local_330,"../../datasets/dblp.xml",iVar1);
    std::chrono::_V2::system_clock::now();
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_330.m_callbacks.
        super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_330.m_callbacks.
                      super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    local_330.m_parser.super_IParser._vptr_IParser = (_func_int **)&PTR__ParserEM64T_001a0d08;
    asmjit::CodeHolder::~CodeHolder(&local_330.m_parser.m_code);
    asmjit::JitRuntime::~JitRuntime(&local_330.m_parser.m_runtime);
    Centaurus::Grammar<char>::~Grammar(&local_330.m_grammar);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc < 1) return 1;
    int worker_num = std::atoi(argv[1]);
    bool no_action = argc >= 3 && argv[2] == std::string("dry");

    const char *input_path = "../../datasets/dblp.xml";
    const char *grammar_path = "../../grammars/xml.cgr";

    Context<char> context{grammar_path};

    if (!no_action) {
      context.attach(L"ElementBody", parseElementBody);
      context.attach(L"Name", parseName);
      context.attach(L"Value", parseValue);
      context.attach(L"Attribute", parseAttribute);
      context.attach(L"Content", parseContent);
      context.attach(L"Element", parseElement);
    }

    using namespace std::chrono;

    auto start = high_resolution_clock::now();;

    context.parse(input_path, worker_num);

    auto end = high_resolution_clock::now();;

    std::cout << worker_num << " " << duration_cast<milliseconds>(end - start).count() << std::endl;

    return 0;
}